

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O3

void __thiscall
program_options::unknown_option::unknown_option(unknown_option *this,string *original_token)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"unrecognised option \'%canonical_option%\'","");
  error_with_no_option_name::error_with_no_option_name
            (&this->super_error_with_no_option_name,&local_40,original_token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_error_with_no_option_name).super_error_with_option_name.super_error
       = &PTR__error_with_option_name_00171990;
  return;
}

Assistant:

unknown_option(const std::string& original_token = "")
    : error_with_no_option_name("unrecognised option '%canonical_option%'", original_token)
    {
    }